

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int rsa1_loadpub_s(BinarySource *src,BinarySink *bs,char **commentptr,char **errorstr)

{
  _Bool _Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s_00;
  char *__s_01;
  ptrlen pVar6;
  char *local_e0;
  char *local_c0;
  char *commentp;
  char *modp;
  char *expp;
  char *bitsp;
  char *p;
  char *line;
  char *pcStack_88;
  _Bool is_privkey_file;
  char *error;
  undefined1 local_78 [4];
  int ret;
  RSAKey key;
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  BinarySource *src_local;
  
  pcStack_88 = (char *)0x0;
  error._4_4_ = 0;
  pVar6.len = 0x21;
  pVar6.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  key.sshk.vt = (ssh_keyalg *)errorstr;
  _Var1 = expect_signature(src,pVar6);
  BinarySource_REWIND_TO__(src->binarysource_,0);
  if (_Var1) {
    memset(local_78,0,0x48);
    iVar2 = rsa1_load_s_internal
                      (src,(RSAKey *)local_78,true,commentptr,(char *)0x0,&stack0xffffffffffffff78);
    if (iVar2 != 0) {
      rsa_ssh1_public_blob(bs,(RSAKey *)local_78,RSA_SSH1_EXPONENT_FIRST);
      freersakey((RSAKey *)local_78);
      error._4_4_ = 1;
    }
    goto LAB_00111d36;
  }
  pVar6 = BinarySource_get_chomped_line(src->binarysource_);
  __s = mkstr(pVar6);
  sVar3 = strspn(__s,"0123456789");
  pcVar4 = __s + sVar3;
  if (*pcVar4 == ' ') {
    __s_00 = pcVar4 + 1;
    *pcVar4 = '\0';
    sVar3 = strspn(__s_00,"0123456789");
    pcVar4 = __s_00 + sVar3;
    if (*pcVar4 == ' ') {
      __s_01 = pcVar4 + 1;
      *pcVar4 = '\0';
      sVar3 = strspn(__s_01,"0123456789");
      pcVar4 = __s_01 + sVar3;
      if (*pcVar4 == '\0') {
        local_c0 = (char *)0x0;
      }
      else {
        if (*pcVar4 != ' ') goto LAB_00111d1d;
        local_c0 = pcVar4 + 1;
        *pcVar4 = '\0';
      }
      memset(local_78,0,0x48);
      key.modulus = mp_from_decimal(__s_00);
      key._0_8_ = mp_from_decimal(__s_01);
      iVar2 = atoi(__s);
      sVar5 = mp_get_nbits((mp_int *)key._0_8_);
      if ((long)iVar2 == sVar5) {
        if (commentptr != (char **)0x0) {
          if (local_c0 == (char *)0x0) {
            local_e0 = (char *)0x0;
          }
          else {
            local_e0 = dupstr(local_c0);
          }
          *commentptr = local_e0;
        }
        rsa_ssh1_public_blob(bs,(RSAKey *)local_78,RSA_SSH1_EXPONENT_FIRST);
        freersakey((RSAKey *)local_78);
        safefree(__s);
        return 1;
      }
      mp_free(key.modulus);
      mp_free((mp_int *)key._0_8_);
      safefree(__s);
      pcStack_88 = "key bit count does not match in SSH-1 public key file";
      goto LAB_00111d36;
    }
  }
LAB_00111d1d:
  safefree(__s);
  pcStack_88 = "not an SSH-1 RSA file";
LAB_00111d36:
  if ((error._4_4_ != 1) && (key.sshk.vt != (ssh_keyalg *)0x0)) {
    (key.sshk.vt)->new_pub = (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen *)pcStack_88;
  }
  return error._4_4_;
}

Assistant:

int rsa1_loadpub_s(BinarySource *src, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    RSAKey key;
    int ret;
    const char *error = NULL;

    /* Default return if we fail. */
    ret = 0;

    bool is_privkey_file = expect_signature(src, rsa1_signature);
    BinarySource_REWIND(src);

    if (is_privkey_file) {
        /*
         * Load just the public half from an SSH-1 private key file.
         */
        memset(&key, 0, sizeof(key));
        if (rsa1_load_s_internal(src, &key, true, commentptr, NULL, &error)) {
            rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
            freersakey(&key);
            ret = 1;
        }
    } else {
        /*
         * Try interpreting the file as an SSH-1 public key.
         */
        char *line, *p, *bitsp, *expp, *modp, *commentp;

        line = mkstr(get_chomped_line(src));
        p = line;

        bitsp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        expp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        modp = p;
        p += strspn(p, "0123456789");
        if (*p) {
            if (*p != ' ')
                goto not_public_either;
            *p++ = '\0';
            commentp = p;
        } else {
            commentp = NULL;
        }

        memset(&key, 0, sizeof(key));
        key.exponent = mp_from_decimal(expp);
        key.modulus = mp_from_decimal(modp);
        if (atoi(bitsp) != mp_get_nbits(key.modulus)) {
            mp_free(key.exponent);
            mp_free(key.modulus);
            sfree(line);
            error = "key bit count does not match in SSH-1 public key file";
            goto end;
        }
        if (commentptr)
            *commentptr = commentp ? dupstr(commentp) : NULL;
        rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
        freersakey(&key);
        sfree(line);
        return 1;

      not_public_either:
        sfree(line);
        error = "not an SSH-1 RSA file";
    }

  end:
    if ((ret != 1) && errorstr)
        *errorstr = error;
    return ret;
}